

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcLoad.c
# Opt level: O3

int Bmc_LoadGetSatVar(Bmc_Load_t *p,int Id)

{
  Gia_Obj_t *pGVar1;
  Vec_Int_t *p_00;
  uint uVar2;
  uint *puVar3;
  
  if ((-1 < Id) && (Id < p->pGia->nObjs)) {
    pGVar1 = p->pGia->pObjs;
    uVar2 = pGVar1[(uint)Id].Value;
    if (uVar2 == 0) {
      puVar3 = &pGVar1[(uint)Id].Value;
      p_00 = p->vSat2Id;
      *puVar3 = p_00->nSize;
      Vec_IntPush(p_00,Id);
      sat_solver_setnvars(p->pSat,p->vSat2Id->nSize);
      uVar2 = *puVar3;
    }
    return uVar2;
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

int Bmc_LoadGetSatVar( Bmc_Load_t * p, int Id )
{
    Gia_Obj_t * pObj = Gia_ManObj( p->pGia, Id );
    if ( pObj->Value == 0 )
    {
        pObj->Value = Vec_IntSize( p->vSat2Id );
        Vec_IntPush( p->vSat2Id, Id );
        sat_solver_setnvars( p->pSat, Vec_IntSize(p->vSat2Id) );
    }
    return pObj->Value;
}